

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::HasNonBuiltInCallee(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicProfileInfo *this_00;
  ProfileId local_1a;
  ProfileId i;
  FunctionBody *this_local;
  
  local_1a = 0;
  while( true ) {
    if (this->profiledCallSiteCount <= local_1a) {
      return false;
    }
    bVar2 = HasDynamicProfileInfo(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1e9d,"(HasDynamicProfileInfo())","HasDynamicProfileInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator->(&this->dynamicProfileInfo)
    ;
    bVar2 = DynamicProfileInfo::MayHaveNonBuiltinCallee(this_00,local_1a);
    if (bVar2) break;
    local_1a = local_1a + 1;
  }
  return true;
}

Assistant:

bool FunctionBody::HasNonBuiltInCallee()
    {
        for (ProfileId i = 0; i < profiledCallSiteCount; i++)
        {
            Assert(HasDynamicProfileInfo());
            if (dynamicProfileInfo->MayHaveNonBuiltinCallee(i))
            {
                return true;
            }
        }
        return false;
    }